

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall embree::XMLWriter::store(XMLWriter *this,SpotLight *light,ssize_t id)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  int in_EDX;
  long in_RSI;
  XMLWriter *in_RDI;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Vec3fa dy;
  Vec3fa dx;
  Vec3fa dx1;
  Vec3fa dx0;
  vfloat4 b1;
  vfloat4 a1;
  vfloat4 b0;
  vfloat4 a0;
  __m128 mask;
  __m128 c_3;
  __m128 r;
  __m128 a_3;
  __m128 c_5;
  __m128 r_1;
  __m128 a_5;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  vfloat4 c_1;
  vfloat4 b_1;
  vfloat4 a_1;
  vfloat4 c_4;
  vfloat4 b_3;
  vfloat4 a_4;
  vfloat4 c_2;
  vfloat4 b_2;
  vfloat4 a_2;
  AffineSpace3fa *in_stack_ffffffffffffe8d0;
  allocator *paVar10;
  char *name;
  XMLWriter *this_00;
  allocator local_16f9;
  string local_16f8 [32];
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined1 local_16c8 [16];
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined1 local_1698 [16];
  undefined1 local_1688 [16];
  undefined8 local_1678;
  undefined8 uStack_1670;
  allocator local_1651;
  string local_1650 [32];
  int local_1630;
  long local_1628;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  ulong local_15f8;
  ulong uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  ulong local_15d8;
  ulong uStack_15d0;
  ulong local_15c8;
  ulong uStack_15c0;
  undefined1 (*local_15b0) [16];
  undefined8 *local_15a8;
  undefined8 *local_15a0;
  undefined8 *local_1598;
  undefined8 *local_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined1 local_1558 [16];
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_1538;
  undefined8 uStack_1530;
  undefined1 local_1528 [16];
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 *local_14f0;
  undefined1 (*local_14e8) [16];
  undefined8 *local_14e0;
  undefined8 *local_14d8;
  undefined8 *local_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 *local_14b0;
  undefined1 *local_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 *local_1470;
  undefined1 *local_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 *local_1430;
  undefined8 *local_1428;
  undefined8 *local_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 *local_1400;
  undefined8 *local_13f8;
  undefined8 *local_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 *local_13d0;
  undefined1 *local_13c8;
  undefined8 *local_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 *local_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 *local_1380;
  undefined8 *local_1378;
  undefined8 *local_1370;
  undefined8 *local_1368;
  undefined8 *local_1360;
  undefined8 *local_1358;
  undefined8 *local_1350;
  float local_1348;
  float fStack_1344;
  float fStack_1340;
  float fStack_133c;
  undefined8 *local_1338;
  undefined1 *local_1330;
  undefined8 *local_1328;
  undefined8 *local_1320;
  float local_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  undefined8 *local_1308;
  undefined8 *local_1300;
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [16];
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined1 *local_1298;
  undefined8 *local_1290;
  undefined8 *local_1288;
  undefined8 *local_1280;
  undefined1 *local_1278;
  undefined8 *local_1270;
  undefined8 *local_1268;
  undefined8 *local_1260;
  undefined8 *local_1258;
  undefined8 *local_1250;
  float local_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  undefined8 local_1238;
  undefined8 uStack_1230;
  float local_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  undefined8 *local_1210;
  undefined8 *local_1208;
  undefined8 *local_1200;
  float fStack_11f4;
  float fStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  float local_11b4;
  undefined4 local_11b0;
  float local_11ac;
  ulong *local_11a8;
  float local_119c;
  float local_1198;
  undefined4 local_1194;
  ulong *local_1190;
  ulong local_1188;
  ulong uStack_1180;
  undefined4 local_1178;
  float local_1174;
  float local_1170;
  undefined4 local_116c;
  ulong local_1168;
  ulong uStack_1160;
  float local_1158;
  undefined4 local_1154;
  float local_1150;
  undefined4 local_114c;
  undefined8 *local_1148;
  undefined8 *local_1140;
  ulong *local_1138;
  undefined8 *local_1130;
  char *local_1128;
  XMLWriter *pXStack_1120;
  ulong *local_1118;
  ulong *local_1110;
  undefined1 local_1101;
  ulong *local_1100;
  ulong local_10f8;
  ulong uStack_10f0;
  ulong *local_10e0;
  undefined4 local_10d8;
  undefined4 uStack_10d4;
  undefined4 uStack_10d0;
  undefined4 uStack_10cc;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  ulong uStack_10b0;
  ulong *local_10a8;
  ulong *local_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 *local_1088;
  undefined8 *local_1080;
  ulong local_1078;
  ulong uStack_1070;
  ulong *local_1068;
  ulong *local_1060;
  long local_1058;
  ulong uStack_1050;
  ulong *local_1048;
  ulong *local_1040;
  undefined1 (*local_1038) [16];
  undefined8 *local_1030;
  undefined8 *local_1028;
  undefined8 *local_1020;
  undefined8 *local_1018;
  undefined8 *local_1010;
  undefined8 *local_1008;
  undefined1 *local_1000;
  undefined1 (*local_ff8) [16];
  undefined8 *local_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  float local_fcc;
  ulong *local_fc8;
  undefined8 *local_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  float local_f9c;
  undefined8 *local_f98;
  undefined8 *local_f90;
  ulong local_f88;
  undefined8 uStack_f80;
  undefined1 local_f78 [16];
  ulong local_f68;
  undefined8 uStack_f60;
  float local_f4c;
  ulong local_f48;
  undefined8 uStack_f40;
  undefined1 local_f38 [16];
  ulong local_f28;
  undefined8 uStack_f20;
  float local_f14;
  undefined8 *local_f10;
  undefined8 *local_f08;
  undefined8 *local_f00;
  float local_ef8;
  float fStack_ef4;
  float fStack_ef0;
  float fStack_eec;
  undefined8 *local_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 *local_eb0;
  ulong *local_ea8;
  undefined8 *local_ea0;
  float local_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  undefined8 *local_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  ulong local_e68;
  ulong uStack_e60;
  ulong *local_e50;
  ulong *local_e48;
  long *local_e40;
  undefined4 local_e38;
  float fStack_e34;
  float fStack_e30;
  undefined4 uStack_e2c;
  long *local_e20;
  ulong local_e18;
  ulong uStack_e10;
  ulong local_e08;
  ulong uStack_e00;
  ulong *local_df0;
  ulong *local_de8;
  ulong *local_de0;
  float local_dd8;
  undefined4 uStack_dd4;
  float fStack_dd0;
  undefined4 uStack_dcc;
  ulong *local_dc0;
  ulong local_db8;
  ulong uStack_db0;
  ulong local_da8;
  ulong uStack_da0;
  undefined8 *local_d90;
  undefined8 *local_d88;
  undefined8 *local_d80;
  float local_d78;
  float fStack_d74;
  float fStack_d70;
  float fStack_d6c;
  undefined8 *local_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  ulong *local_d30;
  ulong *local_d28;
  undefined8 *local_d20;
  float local_d18;
  float fStack_d14;
  float fStack_d10;
  undefined4 uStack_d0c;
  undefined8 *local_d00;
  ulong local_cf8;
  ulong uStack_cf0;
  undefined8 local_ce8;
  ulong uStack_ce0;
  float local_cd4;
  undefined8 *local_cd0;
  float local_cc4;
  undefined8 *local_cc0;
  float local_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float local_c9c;
  float local_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float local_c7c;
  undefined1 local_c78 [16];
  undefined4 local_c5c;
  undefined1 local_c58 [16];
  undefined4 local_c3c;
  undefined1 local_c38 [16];
  float local_c1c;
  undefined1 local_c18 [16];
  undefined4 local_bfc;
  undefined1 local_bf8 [16];
  undefined4 local_bdc;
  undefined1 local_bd8 [16];
  float local_bbc;
  ulong local_bb8;
  undefined8 uStack_bb0;
  ulong local_ba8;
  undefined8 uStack_ba0;
  ulong local_b98;
  undefined8 uStack_b90;
  ulong local_b88;
  undefined8 uStack_b80;
  ulong local_b78;
  undefined8 uStack_b70;
  ulong local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  ulong local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  ulong local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  ulong local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  ulong local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  ulong local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  ulong local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  ulong local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  ulong local_a28;
  undefined8 uStack_a20;
  ulong local_a18;
  undefined8 uStack_a10;
  ulong local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  char *local_9b8;
  XMLWriter *pXStack_9b0;
  ulong local_9a8;
  ulong uStack_9a0;
  ulong local_998;
  ulong uStack_990;
  ulong local_988;
  ulong uStack_980;
  ulong local_978;
  ulong uStack_970;
  ulong local_968;
  ulong uStack_960;
  char *local_958;
  XMLWriter *pXStack_950;
  ulong local_948;
  ulong uStack_940;
  char *local_938;
  XMLWriter *pXStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  long local_8e8;
  ulong uStack_8e0;
  long *local_8d0;
  long local_8c8;
  ulong uStack_8c0;
  long *local_8b8;
  undefined8 *local_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  ulong local_898;
  ulong uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  ulong local_858;
  ulong uStack_850;
  ulong *local_840;
  ulong local_838;
  ulong uStack_830;
  ulong *local_828;
  undefined8 *local_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 *local_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 *local_798;
  undefined8 *local_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  ulong uStack_730;
  undefined8 *local_720;
  undefined8 local_718;
  ulong uStack_710;
  undefined8 *local_708;
  undefined8 *local_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 *local_6e0;
  undefined8 *local_6d8;
  undefined8 *local_6d0;
  undefined8 *local_6c8;
  ulong *local_6c0;
  undefined8 *local_6b8;
  long *local_6b0;
  undefined8 *local_6a8;
  undefined8 *local_6a0;
  undefined8 *local_698;
  undefined8 *local_690;
  undefined8 *local_688;
  ulong *local_680;
  undefined8 *local_678;
  long *local_670;
  undefined8 *local_668;
  undefined8 *local_660;
  undefined8 *local_658;
  undefined8 *local_650;
  float local_648;
  float fStack_644;
  float fStack_640;
  float fStack_63c;
  undefined8 *local_638;
  undefined8 *local_630;
  undefined8 *local_628;
  undefined8 *local_620;
  undefined8 *local_618;
  undefined8 *local_610;
  float local_608;
  float fStack_604;
  float fStack_600;
  float fStack_5fc;
  undefined8 *local_5f8;
  undefined8 *local_5f0;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  undefined8 *local_5b8;
  undefined8 *local_5b0;
  undefined8 *local_5a8;
  undefined8 *local_5a0;
  undefined8 *local_598;
  undefined8 *local_590;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  undefined8 *local_578;
  undefined8 *local_570;
  undefined8 *local_568;
  undefined8 *local_560;
  ulong *local_558;
  undefined8 *local_550;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined8 *local_538;
  undefined8 *local_530;
  ulong *local_528;
  undefined8 *local_520;
  ulong *local_518;
  ulong *local_510;
  float local_508;
  undefined4 uStack_504;
  float fStack_500;
  undefined4 uStack_4fc;
  ulong *local_4f8;
  undefined8 *local_4f0;
  ulong *local_4e8;
  undefined8 *local_4e0;
  undefined8 *local_4d8;
  undefined8 *local_4d0;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  undefined8 *local_4b8;
  undefined8 *local_4b0;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  long *local_498;
  undefined8 *local_490;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined8 *local_470;
  undefined8 *local_468;
  long *local_460;
  long *local_458;
  undefined8 *local_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 *local_430;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  long local_418;
  ulong uStack_410;
  long *local_400;
  ulong *local_3f8;
  undefined8 *local_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 *local_3d0;
  undefined4 local_3c8;
  undefined4 uStack_3c4;
  undefined4 uStack_3c0;
  undefined4 uStack_3bc;
  ulong local_3b8;
  ulong uStack_3b0;
  ulong *local_3a0;
  undefined8 *local_398;
  undefined8 *local_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 *local_370;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 *local_340;
  undefined8 *local_338;
  undefined8 *local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 *local_310;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined8 local_2f8;
  ulong uStack_2f0;
  undefined8 *local_2e0;
  long *local_2d8;
  undefined8 *local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 *local_2b0;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  long local_298;
  ulong uStack_290;
  long *local_280;
  ulong *local_278;
  undefined8 *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 *local_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  ulong local_238;
  ulong uStack_230;
  ulong *local_220;
  undefined8 *local_218;
  undefined8 *local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 *local_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 *local_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 local_178;
  ulong uStack_170;
  undefined8 *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  long local_148;
  ulong uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  ulong local_108;
  ulong uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong local_e8;
  ulong uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  ulong uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 *local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  local_1628 = in_RSI;
  local_1630 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1650,"SpotLight",&local_1651);
  open(in_RDI,(char *)local_1650,local_1630);
  std::__cxx11::string::~string(local_1650);
  std::allocator<char>::~allocator((allocator<char> *)&local_1651);
  local_15b0 = (undefined1 (*) [16])(local_1628 + 0x20);
  local_15a8 = &local_16d8;
  local_1198 = *(float *)(local_1628 + 0x28);
  local_119c = -*(float *)(local_1628 + 0x24);
  local_1190 = &local_15c8;
  local_1194 = 0;
  local_116c = 0;
  local_1178 = 0;
  local_1188 = (ulong)(uint)local_1198 << 0x20;
  uStack_1180 = (ulong)(uint)local_119c;
  local_11ac = -*(float *)(local_1628 + 0x28);
  local_11b4 = *(float *)*local_15b0;
  local_11a8 = &local_15d8;
  local_11b0 = 0;
  local_114c = 0;
  local_1154 = 0;
  local_1168 = (ulong)(uint)local_11ac;
  uStack_1160 = (ulong)(uint)local_11b4;
  local_e40 = &local_1058;
  local_e38 = 0;
  fStack_e34 = local_1198 * local_1198;
  fStack_e30 = local_119c * local_119c;
  uStack_e2c = 0;
  local_8c8 = (ulong)(uint)fStack_e34 << 0x20;
  uStack_8c0 = (ulong)(uint)fStack_e30;
  local_8b8 = &local_8e8;
  local_6a8 = &local_8f8;
  local_448 = CONCAT44(fStack_e34,fStack_e34);
  uStack_440 = CONCAT44(fStack_e34,fStack_e34);
  local_668 = &local_908;
  local_2c8 = CONCAT44(fStack_e30,fStack_e30);
  uStack_2c0 = CONCAT44(fStack_e30,fStack_e30);
  local_4d8 = &local_928;
  local_488 = fStack_e34 + 0.0;
  fStack_484 = fStack_e34 + fStack_e34;
  fStack_480 = fStack_e30 + fStack_e34;
  fStack_47c = fStack_e34 + 0.0;
  local_128 = CONCAT44(fStack_484,local_488);
  uStack_120 = CONCAT44(fStack_47c,fStack_480);
  local_8b0 = &local_918;
  local_4c8 = local_488 + fStack_e30;
  fStack_4c4 = fStack_484 + fStack_e30;
  fStack_4c0 = fStack_480 + fStack_e30;
  fStack_4bc = fStack_47c + fStack_e30;
  local_8a8 = CONCAT44(fStack_4c4,local_4c8);
  uStack_8a0 = CONCAT44(fStack_4bc,fStack_4c0);
  local_de0 = &local_1078;
  local_dd8 = local_11ac * local_11ac;
  uStack_dd4 = 0;
  fStack_dd0 = local_11b4 * local_11b4;
  uStack_dcc = 0;
  local_838 = (ulong)(uint)local_dd8;
  uStack_830 = (ulong)(uint)fStack_dd0;
  local_828 = &local_858;
  local_6b8 = &local_868;
  local_3e8 = 0;
  uStack_3e0 = 0;
  local_678 = &local_878;
  local_268 = CONCAT44(fStack_dd0,fStack_dd0);
  uStack_260 = CONCAT44(fStack_dd0,fStack_dd0);
  local_558 = &local_898;
  local_508 = local_dd8 + 0.0;
  uStack_504 = 0;
  fStack_500 = fStack_dd0 + 0.0;
  uStack_4fc = 0;
  local_e8 = (ulong)(uint)local_508;
  uStack_e0 = (ulong)(uint)fStack_500;
  local_820 = &local_888;
  local_548 = local_508 + fStack_dd0;
  fStack_544 = fStack_dd0 + 0.0;
  fStack_540 = fStack_500 + fStack_dd0;
  fStack_53c = fStack_dd0 + 0.0;
  local_818 = CONCAT44(fStack_544,local_548);
  uStack_810 = CONCAT44(fStack_53c,fStack_540);
  local_1101 = local_548 < local_4c8;
  local_1100 = &local_15f8;
  local_1110 = &local_15c8;
  local_1118 = &local_15d8;
  if ((bool)local_1101) {
    local_9c8 = 0;
    uStack_9c0 = 0;
    local_9d8 = 0;
    uStack_9d0 = 0;
    local_9e8 = 0;
    uStack_9e0 = 0;
    local_9f8 = 0;
    uStack_9f0 = 0;
    local_10d8 = 0xffffffff;
    uStack_10d4 = 0xffffffff;
    uStack_10d0 = 0xffffffff;
    uStack_10cc = 0xffffffff;
    name = (char *)0xffffffffffffffff;
    this_00 = (XMLWriter *)0xffffffffffffffff;
  }
  else {
    local_10c8 = 0;
    uStack_10c0 = 0;
    name = (char *)0x0;
    this_00 = (XMLWriter *)0x0;
  }
  local_978 = (ulong)name & local_1188;
  uStack_970 = (ulong)this_00 & uStack_1180;
  local_988 = ~(ulong)name & local_1168;
  uStack_980 = ~(ulong)this_00 & uStack_1160;
  local_10f8 = local_978 | local_988;
  uStack_10f0 = uStack_970 | uStack_980;
  local_1138 = &local_15f8;
  local_14f0 = &local_15e8;
  local_d20 = &local_10b8;
  local_ce8._0_4_ = (float)local_988;
  local_ce8._4_4_ = (float)(local_978 >> 0x20);
  uStack_ce0._0_4_ = (float)uStack_10f0;
  local_d18 = (float)local_ce8 * (float)local_ce8;
  fStack_d14 = local_ce8._4_4_ * local_ce8._4_4_;
  fStack_d10 = (float)uStack_ce0 * (float)uStack_ce0;
  uStack_d0c = 0;
  local_718 = CONCAT44(fStack_d14,local_d18);
  uStack_710 = (ulong)(uint)fStack_d10;
  local_708 = &local_738;
  local_6d8 = &local_748;
  local_328 = CONCAT44(fStack_d14,fStack_d14);
  uStack_320 = CONCAT44(fStack_d14,fStack_d14);
  local_698 = &local_758;
  local_1a8 = CONCAT44(fStack_d10,fStack_d10);
  uStack_1a0 = CONCAT44(fStack_d10,fStack_d10);
  local_658 = &local_778;
  local_608 = local_d18 + fStack_d14;
  fStack_604 = fStack_d14 + fStack_d14;
  fStack_600 = fStack_d10 + fStack_d14;
  fStack_5fc = fStack_d14 + 0.0;
  local_68 = CONCAT44(fStack_604,local_608);
  uStack_60 = CONCAT44(fStack_5fc,fStack_600);
  local_700 = &local_768;
  local_f4c = local_608 + fStack_d10;
  fStack_644 = fStack_604 + fStack_d10;
  fStack_640 = fStack_600 + fStack_d10;
  fStack_63c = fStack_5fc + fStack_d10;
  local_6f8 = CONCAT44(fStack_644,local_f4c);
  uStack_6f0 = CONCAT44(fStack_63c,fStack_640);
  local_bd8 = ZEXT416((uint)local_f4c);
  local_f68 = CONCAT44(0,local_f4c);
  uStack_f60 = 0;
  uStack_ba0 = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_f68;
  local_f78 = rsqrtss(auVar2,auVar2);
  local_bdc = 0x3fc00000;
  local_bf8 = ZEXT416(0x3fc00000);
  local_a38 = local_f78._0_8_;
  uVar6 = local_a38;
  uStack_a30 = local_f78._8_8_;
  local_a38._0_4_ = local_f78._0_4_;
  local_a28 = (ulong)(uint)((float)local_a38 * 1.5);
  uStack_a20 = 0;
  local_bfc = 0xbf000000;
  local_c18 = ZEXT416(0xbf000000);
  local_a58 = local_c18._0_8_;
  uStack_a50 = 0;
  local_a48 = (ulong)(uint)(local_f4c * -0.5);
  uStack_a40 = 0;
  local_a78 = local_f78._0_8_;
  uStack_a70 = local_f78._8_8_;
  local_fcc = local_f4c * -0.5 * (float)local_a38;
  local_a68 = (ulong)(uint)local_fcc;
  uStack_a60 = 0;
  local_a98 = local_f78._0_8_;
  uStack_a90 = local_f78._8_8_;
  local_a88 = CONCAT44(local_f78._4_4_,(float)local_a38 * (float)local_a38);
  uStack_a80 = local_f78._8_8_;
  local_ab8 = local_a88;
  uStack_ab0 = local_f78._8_8_;
  local_fcc = local_fcc * (float)local_a38 * (float)local_a38;
  local_aa8 = (ulong)(uint)local_fcc;
  uStack_aa0 = 0;
  local_b78 = local_aa8;
  uStack_b70 = 0;
  local_fcc = (float)local_a38 * 1.5 + local_fcc;
  local_b68 = (ulong)(uint)local_fcc;
  uStack_b60 = 0;
  local_f88 = local_b68;
  uStack_f80 = 0;
  local_a08 = local_b68;
  uStack_a00 = 0;
  local_eb0 = &local_fe8;
  local_e78 = CONCAT44(local_fcc,local_fcc);
  uStack_e70 = CONCAT44(local_fcc,local_fcc);
  local_e98 = (float)local_ce8 * local_fcc;
  fStack_e94 = local_ce8._4_4_ * local_fcc;
  fStack_e90 = (float)uStack_ce0 * local_fcc;
  fStack_e8c = local_fcc * 0.0;
  local_16d8 = CONCAT44(fStack_e94,local_e98);
  uStack_16d0 = CONCAT44(fStack_e8c,fStack_e90);
  local_14e0 = &local_1618;
  local_1448 = *(undefined8 *)*local_15b0;
  uStack_1440 = *(undefined8 *)(local_1628 + 0x28);
  local_1430 = &local_1508;
  auVar4._8_8_ = uStack_15e0;
  auVar4._0_8_ = local_15e8;
  local_1450 = local_1528;
  local_13c0 = &local_1518;
  fStack_1340 = (float)local_15e8;
  auVar7._12_4_ = (float)((ulong)uStack_15e0 >> 0x20);
  auVar7._0_8_ = auVar4._4_8_;
  auVar7._8_4_ = fStack_1340;
  local_12f8._8_8_ = auVar7._8_8_;
  uStack_13b0 = local_12f8._8_8_;
  uStack_1510 = local_12f8._8_8_;
  local_1488 = *(undefined8 *)*local_15b0;
  uStack_1480 = *(undefined8 *)(local_1628 + 0x28);
  auVar1 = *local_15b0;
  local_1470 = &local_1548;
  local_13f0 = &local_1538;
  auVar8._12_4_ = (float)((ulong)uStack_1480 >> 0x20);
  auVar8._0_8_ = auVar1._4_8_;
  auVar8._8_4_ = (float)local_1488;
  local_12e8._8_8_ = auVar8._8_8_;
  uStack_13e0 = local_12e8._8_8_;
  uStack_1530 = local_12e8._8_8_;
  local_1490 = local_1558;
  local_1380 = &local_1588;
  uStack_11e0 = local_12e8._8_8_;
  local_11e8._0_4_ = auVar1._4_4_;
  local_11e8._4_4_ = auVar1._8_4_;
  fStack_11f4 = (float)((ulong)local_15e8 >> 0x20);
  fStack_11f0 = (float)uStack_15e0;
  local_1318 = (float)local_11e8 * fStack_1340;
  fStack_1314 = local_11e8._4_4_ * fStack_11f4;
  fStack_1310 = (float)local_1488 * fStack_11f0;
  fStack_130c = auVar8._12_4_ * auVar7._12_4_;
  local_1428 = &local_1578;
  local_1350 = &local_1398;
  uStack_11d0 = local_12f8._8_8_;
  local_11c8._0_4_ = (float)local_1448;
  local_11c8._4_4_ = (float)((ulong)local_1448 >> 0x20);
  uStack_11c0._0_4_ = (float)uStack_1440;
  uStack_11c0._4_4_ = (float)((ulong)uStack_1440 >> 0x20);
  local_1348 = (float)local_11c8 * fStack_11f4;
  fStack_1344 = local_11c8._4_4_ * fStack_11f0;
  fStack_1340 = (float)uStack_11c0 * fStack_1340;
  fStack_133c = uStack_11c0._4_4_ * auVar7._12_4_;
  local_1238 = CONCAT44(fStack_1344,local_1348);
  uStack_1230 = CONCAT44(fStack_133c,fStack_1340);
  local_1248 = (float)local_1588;
  fStack_1244 = (float)((ulong)local_1588 >> 0x20);
  fStack_1240 = (float)uStack_1580;
  fStack_123c = (float)((ulong)uStack_1580 >> 0x20);
  local_1228 = local_1348 - local_1248;
  fStack_1224 = fStack_1344 - fStack_1244;
  fStack_1220 = fStack_1340 - fStack_1240;
  auVar9._12_4_ = fStack_133c - fStack_123c;
  local_12a8 = CONCAT44(fStack_1224,local_1228);
  uStack_12a0 = CONCAT44(auVar9._12_4_,fStack_1220);
  local_1420 = &local_1568;
  auVar3._8_8_ = uStack_12a0;
  auVar3._0_8_ = local_12a8;
  auVar9._0_8_ = auVar3._4_8_;
  auVar9._8_4_ = local_1228;
  local_12d8._8_8_ = auVar9._8_8_;
  uStack_1410 = local_12d8._8_8_;
  uStack_1560 = local_12d8._8_8_;
  uStack_14c0 = local_12d8._8_8_;
  uStack_1610 = local_12d8._8_8_;
  local_1140 = &local_1608;
  local_d80 = &local_1098;
  uStack_d40 = local_12d8._8_8_;
  uStack_d50 = local_12d8._8_8_;
  local_d78 = fStack_1224 * fStack_1224;
  fStack_d74 = fStack_1220 * fStack_1220;
  fStack_d70 = local_1228 * local_1228;
  fStack_d6c = auVar9._12_4_ * auVar9._12_4_;
  local_7a8 = CONCAT44(fStack_d74,local_d78);
  uStack_7a0 = CONCAT44(fStack_d6c,fStack_d70);
  local_798 = &local_7c8;
  local_6c8 = &local_7d8;
  local_388 = CONCAT44(fStack_d74,fStack_d74);
  uStack_380 = CONCAT44(fStack_d74,fStack_d74);
  local_688 = &local_7e8;
  local_208 = CONCAT44(fStack_d70,fStack_d70);
  uStack_200 = CONCAT44(fStack_d70,fStack_d70);
  local_5d8 = &local_808;
  local_588 = local_d78 + fStack_d74;
  fStack_584 = fStack_d74 + fStack_d74;
  fStack_580 = fStack_d70 + fStack_d74;
  fStack_57c = fStack_d6c + fStack_d74;
  local_a8 = CONCAT44(fStack_584,local_588);
  uStack_a0 = CONCAT44(fStack_57c,fStack_580);
  local_790 = &local_7f8;
  local_f14 = local_588 + fStack_d70;
  fStack_5c4 = fStack_584 + fStack_d70;
  fStack_5c0 = fStack_580 + fStack_d70;
  fStack_5bc = fStack_57c + fStack_d70;
  local_788 = CONCAT44(fStack_5c4,local_f14);
  uStack_780 = CONCAT44(fStack_5bc,fStack_5c0);
  local_c38 = ZEXT416((uint)local_f14);
  local_f28 = CONCAT44(0,local_f14);
  uStack_f20 = 0;
  uStack_bb0 = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_f28;
  local_f38 = rsqrtss(auVar1,auVar1);
  local_c3c = 0x3fc00000;
  local_c58 = ZEXT416(0x3fc00000);
  local_ad8 = local_f38._0_8_;
  uVar5 = local_ad8;
  uStack_ad0 = local_f38._8_8_;
  local_ad8._0_4_ = local_f38._0_4_;
  local_ac8 = (ulong)(uint)((float)local_ad8 * 1.5);
  uStack_ac0 = 0;
  local_c5c = 0xbf000000;
  local_c78 = ZEXT416(0xbf000000);
  local_af8 = local_c78._0_8_;
  uStack_af0 = 0;
  local_ae8 = (ulong)(uint)(local_f14 * -0.5);
  uStack_ae0 = 0;
  local_b18 = local_f38._0_8_;
  uStack_b10 = local_f38._8_8_;
  local_f9c = local_f14 * -0.5 * (float)local_ad8;
  local_b08 = (ulong)(uint)local_f9c;
  uStack_b00 = 0;
  local_b38 = local_f38._0_8_;
  uStack_b30 = local_f38._8_8_;
  local_b28 = CONCAT44(local_f38._4_4_,(float)local_ad8 * (float)local_ad8);
  uStack_b20 = local_f38._8_8_;
  local_b58 = local_b28;
  uStack_b50 = local_f38._8_8_;
  local_f9c = local_f9c * (float)local_ad8 * (float)local_ad8;
  local_b48 = (ulong)(uint)local_f9c;
  uStack_b40 = 0;
  local_b98 = local_b48;
  uStack_b90 = 0;
  local_f9c = (float)local_ad8 * 1.5 + local_f9c;
  local_b88 = (ulong)(uint)local_f9c;
  uStack_b80 = 0;
  local_f48 = local_b88;
  uStack_f40 = 0;
  local_a18 = local_b88;
  uStack_a10 = 0;
  local_f10 = &local_fb8;
  local_ed8 = CONCAT44(local_f9c,local_f9c);
  uStack_ed0 = CONCAT44(local_f9c,local_f9c);
  uStack_ec0 = local_12d8._8_8_;
  local_ef8 = fStack_1224 * local_f9c;
  fStack_ef4 = fStack_1220 * local_f9c;
  fStack_ef0 = local_1228 * local_f9c;
  fStack_eec = auVar9._12_4_ * local_f9c;
  local_1608 = CONCAT44(fStack_ef4,local_ef8);
  uStack_1600 = CONCAT44(fStack_eec,fStack_ef0);
  local_1598 = &local_16d8;
  local_1000 = local_16c8;
  local_ff0 = &local_16b8;
  local_16b8 = *(undefined8 *)*local_15b0;
  uStack_16b0 = *(undefined8 *)(local_1628 + 0x28);
  local_15a0 = (undefined8 *)(local_1628 + 0x10);
  local_1590 = &local_16a8;
  local_40 = local_1698;
  local_38 = local_1688;
  local_20 = local_16c8;
  local_30 = &local_16b8;
  local_14d0 = &local_1678;
  local_1678 = *local_15a0;
  uStack_1670 = *(undefined8 *)(local_1628 + 0x18);
  local_14e8 = local_15b0;
  local_14d8 = local_15a0;
  local_14c8 = auVar9._0_8_;
  local_14b0 = local_14e0;
  local_1418 = auVar9._0_8_;
  local_1400 = local_1420;
  local_13f8 = local_1470;
  local_13e8 = auVar8._0_8_;
  local_13d0 = local_13f0;
  local_13c8 = local_1450;
  local_13b8 = auVar7._0_8_;
  local_13a0 = local_13c0;
  local_1378 = local_13c0;
  local_1370 = local_1430;
  local_1368 = local_1428;
  local_1360 = local_13c0;
  local_1358 = local_1430;
  local_1338 = local_1350;
  local_1330 = local_1490;
  local_1328 = local_13f0;
  local_1320 = local_1380;
  local_1308 = local_1380;
  local_1300 = local_1420;
  local_12f8 = auVar7;
  local_12e8 = auVar8;
  local_12d8 = auVar9;
  local_12b8 = local_1488;
  uStack_12b0 = uStack_1480;
  local_1298 = local_1490;
  local_1290 = local_13f0;
  local_1288 = local_13c0;
  local_1280 = local_1430;
  local_1278 = local_1450;
  local_1270 = local_1470;
  local_1268 = local_1428;
  local_1260 = local_1380;
  local_1258 = local_1350;
  local_1250 = local_1428;
  fStack_121c = auVar9._12_4_;
  local_1210 = local_1428;
  local_1208 = local_1380;
  local_1200 = local_1350;
  local_11e8 = auVar8._0_8_;
  local_11d8 = auVar7._0_8_;
  local_11c8 = local_1448;
  uStack_11c0 = uStack_1440;
  local_1174 = local_1198;
  local_1170 = local_119c;
  local_1158 = local_11ac;
  local_1150 = local_11b4;
  local_1148 = local_14e0;
  local_1130 = local_14f0;
  local_1128 = name;
  pXStack_1120 = this_00;
  local_10e0 = local_1138;
  local_10a8 = local_1138;
  local_10a0 = local_1138;
  local_1088 = local_14e0;
  local_1080 = local_14e0;
  local_1068 = local_11a8;
  local_1060 = local_11a8;
  local_1048 = local_1190;
  local_1040 = local_1190;
  local_1038 = local_15b0;
  local_1030 = local_1140;
  local_1028 = local_14f0;
  local_1020 = local_1598;
  local_1018 = local_14f0;
  local_1010 = local_1598;
  local_1008 = local_1140;
  local_ff8 = local_15b0;
  local_fc8 = local_1138;
  local_fc0 = local_14f0;
  local_f98 = local_14e0;
  local_f90 = local_1140;
  local_f08 = local_14e0;
  local_f00 = local_1140;
  local_ee0 = local_1140;
  local_ec8 = auVar9._0_8_;
  local_ea8 = local_1138;
  local_ea0 = local_14f0;
  local_e80 = local_14f0;
  local_e68 = local_10f8;
  uStack_e60 = uStack_10f0;
  local_e50 = local_1190;
  local_e48 = local_1190;
  local_e20 = local_e40;
  local_e18 = local_1188;
  uStack_e10 = uStack_1180;
  local_e08 = local_1188;
  uStack_e00 = uStack_1180;
  local_df0 = local_11a8;
  local_de8 = local_11a8;
  local_dc0 = local_de0;
  local_db8 = local_1168;
  uStack_db0 = uStack_1160;
  local_da8 = local_1168;
  uStack_da0 = uStack_1160;
  local_d90 = local_14e0;
  local_d88 = local_14e0;
  local_d60 = local_d80;
  local_d58 = auVar9._0_8_;
  local_d48 = auVar9._0_8_;
  local_d30 = local_1138;
  local_d28 = local_1138;
  local_d00 = local_d20;
  local_cf8 = local_10f8;
  uStack_cf0 = uStack_10f0;
  local_ce8 = local_10f8;
  uStack_ce0 = uStack_10f0;
  local_cd4 = local_f9c;
  local_cd0 = local_f10;
  local_cc4 = local_fcc;
  local_cc0 = local_eb0;
  local_cb8 = local_fcc;
  fStack_cb4 = local_fcc;
  fStack_cb0 = local_fcc;
  fStack_cac = local_fcc;
  local_c9c = local_fcc;
  local_c98 = local_f9c;
  fStack_c94 = local_f9c;
  fStack_c90 = local_f9c;
  fStack_c8c = local_f9c;
  local_c7c = local_f9c;
  local_c1c = local_f14;
  local_bbc = local_f4c;
  local_bb8 = local_f28;
  local_ba8 = local_f68;
  local_ad8 = uVar5;
  local_a38 = uVar6;
  local_9b8 = name;
  pXStack_9b0 = this_00;
  local_9a8 = local_1188;
  uStack_9a0 = uStack_1180;
  local_998 = local_1168;
  uStack_990 = uStack_1160;
  local_968 = local_1188;
  uStack_960 = uStack_1180;
  local_958 = name;
  pXStack_950 = this_00;
  local_948 = local_1168;
  uStack_940 = uStack_1160;
  local_938 = name;
  pXStack_930 = this_00;
  local_8d0 = local_e40;
  local_840 = local_de0;
  local_7b0 = local_d80;
  local_720 = local_d20;
  local_6e0 = local_708;
  local_6d0 = local_798;
  local_6c0 = local_828;
  local_6b0 = local_8b8;
  local_6a0 = local_708;
  local_690 = local_798;
  local_680 = local_828;
  local_670 = local_8b8;
  local_660 = local_698;
  local_650 = local_700;
  local_648 = local_f4c;
  local_638 = local_700;
  local_630 = local_698;
  local_628 = local_658;
  local_620 = local_6d8;
  local_618 = local_708;
  local_610 = local_658;
  local_5f8 = local_658;
  local_5f0 = local_6d8;
  local_5e8 = local_708;
  local_5e0 = local_688;
  local_5d0 = local_790;
  local_5c8 = local_f14;
  local_5b8 = local_790;
  local_5b0 = local_688;
  local_5a8 = local_5d8;
  local_5a0 = local_6c8;
  local_598 = local_798;
  local_590 = local_5d8;
  local_578 = local_5d8;
  local_570 = local_6c8;
  local_568 = local_798;
  local_560 = local_678;
  local_550 = local_820;
  local_538 = local_820;
  local_530 = local_678;
  local_528 = local_558;
  local_520 = local_6b8;
  local_518 = local_828;
  local_510 = local_558;
  local_4f8 = local_558;
  local_4f0 = local_6b8;
  local_4e8 = local_828;
  local_4e0 = local_668;
  local_4d0 = local_8b0;
  local_4b8 = local_8b0;
  local_4b0 = local_668;
  local_4a8 = local_4d8;
  local_4a0 = local_6a8;
  local_498 = local_8b8;
  local_490 = local_4d8;
  local_470 = local_4d8;
  local_468 = local_6a8;
  local_460 = local_8b8;
  local_458 = local_8b8;
  local_450 = local_6a8;
  local_430 = local_6a8;
  local_428 = fStack_e34;
  fStack_424 = fStack_e34;
  fStack_420 = fStack_e34;
  fStack_41c = fStack_e34;
  local_418 = local_8c8;
  uStack_410 = uStack_8c0;
  local_400 = local_8b8;
  local_3f8 = local_828;
  local_3f0 = local_6b8;
  local_3d0 = local_6b8;
  local_3c8 = uStack_dd4;
  uStack_3c4 = uStack_dd4;
  uStack_3c0 = uStack_dd4;
  uStack_3bc = uStack_dd4;
  local_3b8 = local_838;
  uStack_3b0 = uStack_830;
  local_3a0 = local_828;
  local_398 = local_798;
  local_390 = local_6c8;
  local_370 = local_6c8;
  local_368 = fStack_d74;
  fStack_364 = fStack_d74;
  fStack_360 = fStack_d74;
  fStack_35c = fStack_d74;
  local_358 = local_7a8;
  uStack_350 = uStack_7a0;
  local_340 = local_798;
  local_338 = local_708;
  local_330 = local_6d8;
  local_310 = local_6d8;
  local_308 = fStack_d14;
  fStack_304 = fStack_d14;
  fStack_300 = fStack_d14;
  fStack_2fc = fStack_d14;
  local_2f8 = local_718;
  uStack_2f0 = uStack_710;
  local_2e0 = local_708;
  local_2d8 = local_8b8;
  local_2d0 = local_668;
  local_2b0 = local_668;
  local_2a8 = fStack_e30;
  fStack_2a4 = fStack_e30;
  fStack_2a0 = fStack_e30;
  fStack_29c = fStack_e30;
  local_298 = local_8c8;
  uStack_290 = uStack_8c0;
  local_280 = local_8b8;
  local_278 = local_828;
  local_270 = local_678;
  local_250 = local_678;
  local_248 = fStack_dd0;
  fStack_244 = fStack_dd0;
  fStack_240 = fStack_dd0;
  fStack_23c = fStack_dd0;
  local_238 = local_838;
  uStack_230 = uStack_830;
  local_220 = local_828;
  local_218 = local_798;
  local_210 = local_688;
  local_1f0 = local_688;
  local_1e8 = fStack_d70;
  fStack_1e4 = fStack_d70;
  fStack_1e0 = fStack_d70;
  fStack_1dc = fStack_d70;
  local_1d8 = local_7a8;
  uStack_1d0 = uStack_7a0;
  local_1c0 = local_798;
  local_1b8 = local_708;
  local_1b0 = local_698;
  local_190 = local_698;
  local_188 = fStack_d10;
  fStack_184 = fStack_d10;
  fStack_180 = fStack_d10;
  fStack_17c = fStack_d10;
  local_178 = local_718;
  uStack_170 = uStack_710;
  local_160 = local_708;
  local_158 = local_448;
  uStack_150 = uStack_440;
  local_148 = local_8c8;
  uStack_140 = uStack_8c0;
  local_138 = local_2c8;
  uStack_130 = uStack_2c0;
  local_118 = local_3e8;
  uStack_110 = uStack_3e0;
  local_108 = local_838;
  uStack_100 = uStack_830;
  local_f8 = local_268;
  uStack_f0 = uStack_260;
  local_d8 = local_388;
  uStack_d0 = uStack_380;
  local_c8 = local_7a8;
  uStack_c0 = uStack_7a0;
  local_b8 = local_208;
  uStack_b0 = uStack_200;
  local_98 = local_328;
  uStack_90 = uStack_320;
  local_88 = local_718;
  uStack_80 = uStack_710;
  local_78 = local_1a8;
  uStack_70 = uStack_1a0;
  local_58 = local_1598;
  local_50 = local_1590;
  local_48 = local_1590;
  local_28 = local_38;
  local_18 = local_40;
  local_10 = local_1598;
  local_8 = local_1590;
  local_16a8 = local_16d8;
  uStack_16a0 = uStack_16d0;
  local_1618 = auVar9._0_8_;
  local_15f8 = local_10f8;
  uStack_15f0 = uStack_10f0;
  local_15e8 = local_16d8;
  uStack_15e0 = uStack_16d0;
  local_15d8 = local_1168;
  uStack_15d0 = uStack_1160;
  local_15c8 = local_1188;
  uStack_15c0 = uStack_1180;
  local_1588 = CONCAT44(fStack_1314,local_1318);
  uStack_1580 = CONCAT44(fStack_130c,fStack_1310);
  local_1578 = local_12a8;
  uStack_1570 = uStack_12a0;
  local_1568 = auVar9._0_8_;
  local_1548 = local_1488;
  uStack_1540 = uStack_1480;
  local_1538 = auVar8._0_8_;
  local_1518 = auVar7._0_8_;
  local_1508 = local_1448;
  uStack_1500 = uStack_1440;
  local_1398 = local_1238;
  uStack_1390 = uStack_1230;
  local_10b8 = local_718;
  uStack_10b0 = uStack_710;
  local_1098 = local_7a8;
  uStack_1090 = uStack_7a0;
  local_1078 = local_838;
  uStack_1070 = uStack_830;
  local_1058 = local_8c8;
  uStack_1050 = uStack_8c0;
  local_fe8 = local_e78;
  uStack_fe0 = uStack_e70;
  local_fb8 = local_ed8;
  uStack_fb0 = uStack_ed0;
  local_928 = local_128;
  uStack_920 = uStack_120;
  local_918 = local_8a8;
  uStack_910 = uStack_8a0;
  local_908 = local_2c8;
  uStack_900 = uStack_2c0;
  local_8f8 = local_448;
  uStack_8f0 = uStack_440;
  local_8e8 = local_8c8;
  uStack_8e0 = uStack_8c0;
  local_898 = local_e8;
  uStack_890 = uStack_e0;
  local_888 = local_818;
  uStack_880 = uStack_810;
  local_878 = local_268;
  uStack_870 = uStack_260;
  local_868 = local_3e8;
  uStack_860 = uStack_3e0;
  local_858 = local_838;
  uStack_850 = uStack_830;
  local_808 = local_a8;
  uStack_800 = uStack_a0;
  local_7f8 = local_788;
  uStack_7f0 = uStack_780;
  local_7e8 = local_208;
  uStack_7e0 = uStack_200;
  local_7d8 = local_388;
  uStack_7d0 = uStack_380;
  local_7c8 = local_7a8;
  uStack_7c0 = uStack_7a0;
  local_778 = local_68;
  uStack_770 = uStack_60;
  local_768 = local_6f8;
  uStack_760 = uStack_6f0;
  local_758 = local_1a8;
  uStack_750 = uStack_1a0;
  local_748 = local_328;
  uStack_740 = uStack_320;
  local_738 = local_718;
  uStack_730 = uStack_710;
  store(this_00,name,in_stack_ffffffffffffe8d0);
  store(this_00,name,(Vec3fa *)in_stack_ffffffffffffe8d0);
  store(this_00,name,(float *)in_stack_ffffffffffffe8d0);
  store(this_00,name,(float *)in_stack_ffffffffffffe8d0);
  paVar10 = &local_16f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16f8,"SpotLight",paVar10);
  close(in_RDI,(int)local_16f8);
  std::__cxx11::string::~string(local_16f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_16f9);
  return;
}

Assistant:

void XMLWriter::store(const SceneGraph::SpotLight& light, ssize_t id)
  {
    open("SpotLight",id);
    store("AffineSpace",AffineSpace3fa(frame(light.D),light.P));
    store("I",light.I);
    store("angleMin",light.angleMin);
    store("angleMax",light.angleMax);
    close("SpotLight");
  }